

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_data(nni_http_chunks *cl,char *buf,size_t n,size_t *lenp)

{
  size_t __n;
  void *pvVar1;
  void *__dest;
  char *dest;
  size_t offset;
  nni_http_chunk *chunk;
  size_t *lenp_local;
  size_t n_local;
  char *buf_local;
  nni_http_chunks *cl_local;
  
  pvVar1 = nni_list_last(&cl->cl_chunks);
  if (pvVar1 == (void *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
              ,0x10d,"chunk != NULL");
  }
  if (cl->cl_state != CS_DATA) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
              ,0x10e,"cl->cl_state == CS_DATA");
  }
  if (*(ulong *)((long)pvVar1 + 0x18) < *(ulong *)((long)pvVar1 + 0x20)) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
              ,0x10f,"chunk->c_resid <= chunk->c_alloc");
  }
  if (*(ulong *)((long)pvVar1 + 0x18) < 3) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
              ,0x110,"chunk->c_alloc > 2");
  }
  __dest = (void *)((*(long *)((long)pvVar1 + 0x18) - *(long *)((long)pvVar1 + 0x20)) +
                   *(long *)((long)pvVar1 + 0x28));
  if (n < *(ulong *)((long)pvVar1 + 0x20)) {
    memcpy(__dest,buf,n);
    *(size_t *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) - n;
    *lenp = n;
    cl_local._4_4_ = NNG_OK;
  }
  else {
    __n = *(size_t *)((long)pvVar1 + 0x20);
    memcpy(__dest,buf,__n);
    if ((*(char *)(*(long *)((long)pvVar1 + 0x28) + *(long *)((long)pvVar1 + 0x10)) == '\r') &&
       (*(char *)(*(long *)((long)pvVar1 + 0x28) + 1 + *(long *)((long)pvVar1 + 0x10)) == '\n')) {
      *(undefined8 *)((long)pvVar1 + 0x20) = 0;
      cl->cl_state = CS_INIT;
      cl->cl_size = 0;
      cl->cl_line = 0;
      *lenp = __n;
      cl_local._4_4_ = NNG_OK;
    }
    else {
      cl_local._4_4_ = NNG_EPROTO;
    }
  }
  return cl_local._4_4_;
}

Assistant:

static nng_err
chunk_ingest_data(nni_http_chunks *cl, char *buf, size_t n, size_t *lenp)
{
	nni_http_chunk *chunk;
	size_t          offset;
	char           *dest;

	chunk = nni_list_last(&cl->cl_chunks);

	NNI_ASSERT(chunk != NULL);
	NNI_ASSERT(cl->cl_state == CS_DATA);
	NNI_ASSERT(chunk->c_resid <= chunk->c_alloc);
	NNI_ASSERT(chunk->c_alloc > 2); // not be zero, plus newlines

	dest   = chunk->c_data;
	offset = chunk->c_alloc - chunk->c_resid;
	dest += offset;

	if (n >= chunk->c_resid) {
		n = chunk->c_resid;
		memcpy(dest, buf, n);

		if ((chunk->c_data[chunk->c_size] != '\r') ||
		    (chunk->c_data[chunk->c_size + 1] != '\n')) {
			return (NNG_EPROTO);
		}
		chunk->c_resid = 0;
		cl->cl_state   = CS_INIT;
		cl->cl_size    = 0;
		cl->cl_line    = 0;
		*lenp          = n;
		return (NNG_OK);
	}

	memcpy(dest, buf, n);
	chunk->c_resid -= n;
	*lenp = n;
	return (NNG_OK);
}